

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

bool __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::iterator::operator!=(iterator *this,iterator *other)

{
  bool bVar1;
  bool bVar2;
  vector<int,_std::allocator<int>_> local_b8;
  int *local_a0;
  int *piStack_98;
  _Any_data local_90;
  code *local_80;
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_70;
  _Base_ptr local_40;
  byte local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_b8,&(other->source).source.source.source);
  local_a0 = (other->source).source.source.current._M_current;
  piStack_98 = (other->source).source.source.end._M_current;
  std::function<bool_(const_int_&)>::function
            ((function<bool_(const_int_&)> *)&local_90,&(other->source).transformer);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&local_70,&(other->source).result._M_t);
  local_40 = (other->source).current._M_node;
  bVar1 = other->valid;
  bVar2 = this->valid;
  local_38 = bVar1;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_70);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)((bVar2 | bVar1) & 1);
}

Assistant:

bool operator!=(iterator other) const { return !(*this == other); }